

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O1

int libssh2_session_handshake(LIBSSH2_SESSION *session,libssh2_socket_t sock)

{
  char *__src;
  bool bVar1;
  size_t *psVar2;
  uint uVar3;
  int iVar4;
  uint32_t uVar5;
  int iVar6;
  ssize_t sVar7;
  uchar *puVar8;
  long lVar9;
  char *pcVar10;
  int unaff_EBX;
  size_t sVar11;
  ulong __n;
  char local_71;
  uchar **local_70;
  packet_require_state_t *local_68;
  size_t *local_60;
  uchar *local_58;
  uchar *local_50;
  uchar *local_48;
  key_exchange_state_t *local_40;
  time_t local_38;
  
  local_38 = time((time_t *)0x0);
  __src = session->banner_TxRx_banner;
  local_40 = &session->startup_key_state;
  local_48 = session->startup_service + 1;
  local_50 = session->startup_service + 5;
  local_58 = session->startup_service;
  local_70 = &session->startup_data;
  local_60 = &session->startup_data_len;
  local_68 = &session->startup_req_state;
LAB_00122df0:
  if (session != (LIBSSH2_SESSION *)0x0) {
    if (session->startup_state != libssh2_NB_state_idle) {
LAB_00122e8b:
      iVar4 = unaff_EBX;
      if (session->startup_state == libssh2_NB_state_created) {
        sVar11 = 0x1c;
        pcVar10 = "SSH-2.0-libssh2_1.11.2_DEV\r\n";
        if (session->banner_TxRx_state == libssh2_NB_state_idle) {
          pcVar10 = (char *)(session->local).banner;
          if ((uchar *)pcVar10 == (uchar *)0x0) {
            pcVar10 = "SSH-2.0-libssh2_1.11.2_DEV\r\n";
          }
          else {
            sVar11 = strlen(pcVar10);
          }
          session->banner_TxRx_state = libssh2_NB_state_created;
        }
        *(byte *)&session->socket_block_directions = (byte)session->socket_block_directions & 0xfd;
        sVar7 = (*session->send)(session->socket_fd,
                                 (uchar *)pcVar10 + session->banner_TxRx_total_send,
                                 sVar11 - session->banner_TxRx_total_send,
                                 (uint)((session->flag).sigpipe == 0) << 0xe,&session->abstract);
        if (sVar7 == sVar11 - session->banner_TxRx_total_send) {
          session->banner_TxRx_state = libssh2_NB_state_idle;
          lVar9 = 0;
          iVar4 = 0;
LAB_00122f9f:
          session->banner_TxRx_total_send = lVar9;
        }
        else {
          if (sVar7 < 0 && sVar7 != -0xb) {
            session->banner_TxRx_state = libssh2_NB_state_idle;
            iVar4 = -0x2b;
            lVar9 = 0;
            goto LAB_00122f9f;
          }
          session->socket_block_directions = 2;
          if (0 < sVar7) {
            lVar9 = session->banner_TxRx_total_send + sVar7;
            iVar4 = -0x25;
            goto LAB_00122f9f;
          }
          iVar4 = -0x25;
        }
        if (iVar4 == -0x25) goto LAB_001233e0;
        if (iVar4 != 0) {
          pcVar10 = "Failed sending banner";
          goto LAB_001233d9;
        }
        session->startup_state = libssh2_NB_state_sent;
        session->banner_TxRx_state = libssh2_NB_state_idle;
      }
      if (session->startup_state == libssh2_NB_state_sent) {
LAB_00122fdb:
        if (session->banner_TxRx_state == libssh2_NB_state_idle) {
          session->banner_TxRx_state = libssh2_NB_state_created;
          __n = 0;
        }
        else {
          __n = session->banner_TxRx_total_send;
        }
        do {
          if ((0x1fff < __n) || ((__n != 0 && (__src[__n - 1] == '\n')))) goto LAB_00123119;
          local_71 = '\0';
          *(byte *)&session->socket_block_directions = (byte)session->socket_block_directions & 0xfe
          ;
          sVar7 = (*session->recv)(session->socket_fd,&local_71,1,
                                   (uint)((session->flag).sigpipe == 0) << 0xe,&session->abstract);
          if (sVar7 < 0) {
            if (sVar7 == -0xb) {
              session->socket_block_directions = 1;
              session->banner_TxRx_total_send = __n;
              bVar1 = true;
              iVar4 = -0x25;
            }
            else {
              session->banner_TxRx_state = libssh2_NB_state_idle;
              session->banner_TxRx_total_send = 0;
              bVar1 = true;
              iVar4 = -0x2b;
            }
          }
          else if (sVar7 == 0) {
            session->socket_state = -1;
            bVar1 = true;
            iVar4 = -0xd;
          }
          else if ((__n == 0) && (local_71 == '\r' || local_71 == '\n')) {
            bVar1 = false;
            __n = 0;
          }
          else if (local_71 == '\0') {
            session->banner_TxRx_state = libssh2_NB_state_idle;
            session->banner_TxRx_total_send = 0;
            bVar1 = true;
            iVar4 = -2;
          }
          else {
            __src[__n] = local_71;
            __n = __n + 1;
            bVar1 = false;
          }
        } while (!bVar1);
        goto LAB_001231c2;
      }
      goto LAB_001231f8;
    }
    if (sock != -1) {
      session->socket_fd = sock;
      uVar3 = fcntl(sock,3,0);
      uVar3 = uVar3 >> 0xb & 1;
      session->socket_prev_blockstate = uVar3 ^ 1;
      if (uVar3 == 0) {
        unaff_EBX = session->socket_fd;
        uVar3 = fcntl(unaff_EBX,3,0);
        iVar4 = fcntl(unaff_EBX,4,(ulong)(uVar3 | 0x800));
        if (iVar4 != 0) {
          pcVar10 = "Failed changing socket\'s blocking state to non-blocking";
          goto LAB_001233d9;
        }
      }
      session->startup_state = libssh2_NB_state_created;
      goto LAB_00122e8b;
    }
    iVar4 = -0x2d;
    pcVar10 = "Bad socket provided";
    goto LAB_001233d9;
  }
  libssh2_session_handshake_cold_1();
  iVar4 = -0xe;
  goto LAB_001233e0;
  while (__n = __n - 1, __n != 0) {
LAB_00123119:
    if ((session->banner_TxRx_banner[__n - 1] != '\r') &&
       (session->banner_TxRx_banner[__n - 1] != '\n')) {
      session->banner_TxRx_state = libssh2_NB_state_idle;
      session->banner_TxRx_total_send = 0;
      puVar8 = (session->remote).banner;
      if (puVar8 != (uchar *)0x0) {
        (*session->free)(puVar8,&session->abstract);
      }
      puVar8 = (uchar *)(*session->alloc)(__n + 1,&session->abstract);
      (session->remote).banner = puVar8;
      if (puVar8 == (uchar *)0x0) {
        iVar4 = _libssh2_error(session,-6,"Error allocating space for remote banner");
      }
      else {
        memcpy(puVar8,__src,__n);
        (session->remote).banner[__n] = '\0';
        iVar4 = 0;
      }
      goto LAB_001231c2;
    }
  }
  session->banner_TxRx_state = libssh2_NB_state_idle;
  session->banner_TxRx_total_send = 0;
  iVar4 = -2;
LAB_001231c2:
  if (iVar4 != 0) {
    if (iVar4 == -0x25) goto LAB_001233e0;
    pcVar10 = "Failed getting banner";
    goto LAB_001233d9;
  }
  iVar6 = strncmp("SSH-",(char *)(session->remote).banner,4);
  if (iVar6 == 0) goto code_r0x001231ed;
  goto LAB_00122fdb;
code_r0x001231ed:
  session->startup_state = libssh2_NB_state_sent1;
LAB_001231f8:
  if (session->startup_state == libssh2_NB_state_sent1) {
    iVar4 = _libssh2_kex_exchange(session,0,local_40);
    if (iVar4 == -0x25) goto LAB_001233e0;
    if (iVar4 == 0) {
      session->startup_state = libssh2_NB_state_sent2;
      goto LAB_0012322f;
    }
    pcVar10 = "Unable to exchange encryption keys";
  }
  else {
LAB_0012322f:
    if (session->startup_state == libssh2_NB_state_sent2) {
      session->startup_service[0] = '\x05';
      _libssh2_htonu32(local_48,0xc);
      builtin_memcpy(local_50,"ssh-userauth",0xc);
      session->startup_state = libssh2_NB_state_sent3;
    }
    if (session->startup_state == libssh2_NB_state_sent3) {
      iVar4 = _libssh2_transport_send(session,local_58,0x11,(uchar *)0x0,0);
      if (iVar4 == -0x25) goto LAB_001233e0;
      if (iVar4 != 0) {
        pcVar10 = "Unable to ask for ssh-userauth service";
        goto LAB_001233d9;
      }
      session->startup_state = libssh2_NB_state_sent4;
    }
    psVar2 = local_60;
    iVar4 = -0x22;
    if (session->startup_state != libssh2_NB_state_sent4) goto LAB_001233e0;
    iVar4 = _libssh2_packet_require(session,'\x06',local_70,local_60,0,(uchar *)0x0,0,local_68);
    if (iVar4 == 0) {
      if (*psVar2 < 5) {
        iVar4 = -0xe;
        pcVar10 = "Unexpected packet length";
      }
      else {
        uVar5 = _libssh2_ntohu32(session->startup_data + 1);
        session->startup_service_length = (ulong)uVar5;
        if (uVar5 == 0xc) {
          puVar8 = *local_70;
          iVar4 = strncmp("ssh-userauth",(char *)(puVar8 + 5),0xc);
          if (iVar4 == 0) {
            (*session->free)(puVar8,&session->abstract);
            session->startup_data = (uchar *)0x0;
            session->startup_state = libssh2_NB_state_idle;
            iVar4 = 0;
            goto LAB_001233e0;
          }
        }
        (*session->free)(session->startup_data,&session->abstract);
        session->startup_data = (uchar *)0x0;
        iVar4 = -0xe;
        pcVar10 = "Invalid response received from server";
      }
    }
    else {
      pcVar10 = "Failed to get response to ssh-userauth request";
    }
  }
LAB_001233d9:
  iVar4 = _libssh2_error(session,iVar4,pcVar10);
LAB_001233e0:
  if (session == (LIBSSH2_SESSION *)0x0) {
    return iVar4;
  }
  if (iVar4 != -0x25) {
    return iVar4;
  }
  if (session->api_block_mode == 0) {
    return -0x25;
  }
  iVar6 = _libssh2_wait_socket(session,local_38);
  unaff_EBX = iVar4;
  if (iVar6 != 0) {
    return iVar6;
  }
  goto LAB_00122df0;
}

Assistant:

LIBSSH2_API int
libssh2_session_handshake(LIBSSH2_SESSION *session, libssh2_socket_t sock)
{
    int rc;

    BLOCK_ADJUST(rc, session, session_startup(session, sock));

    return rc;
}